

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_small_width_height_test.cc
# Opt level: O2

void anon_unknown.dwarf_103885e::EncodeSmallHeightMultiThreaded
               (aom_img_fmt fmt,aom_codec_flags_t flag)

{
  aom_codec_iface_t *iface;
  pointer *__ptr;
  SEARCH_METHODS *pSVar1;
  AssertHelper local_4a8;
  AssertHelper local_4a0;
  AssertionResult gtest_ar_2;
  aom_codec_ctx_t enc;
  aom_image_t img;
  aom_codec_enc_cfg_t cfg;
  
  enc.name = (char *)&img;
  gtest_ar_2._0_8_ =
       aom_img_wrap((aom_image_t *)enc.name,fmt,0x200,0x40,1,(anonymous_namespace)::kBuffer);
  testing::internal::CmpHelperEQ<aom_image*,aom_image*>
            ((internal *)&cfg,"&img",
             "aom_img_wrap(&img, fmt, kWidth, kHeight, 1, const_cast<unsigned char *>(kBuffer))",
             (aom_image **)&enc,(aom_image **)&gtest_ar_2);
  if ((char)cfg.g_usage == '\0') {
    testing::Message::Message((Message *)&enc);
    if ((undefined8 *)CONCAT44(cfg.g_w,cfg.g_profile) == (undefined8 *)0x0) {
      pSVar1 = "";
    }
    else {
      pSVar1 = *(SEARCH_METHODS **)CONCAT44(cfg.g_w,cfg.g_profile);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x74,(char *)pSVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&enc);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (enc.name != (char *)0x0) {
      (**(code **)(*(long *)enc.name + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cfg.g_profile);
  iface = aom_codec_av1_cx();
  gtest_ar_2._0_8_ = gtest_ar_2._0_8_ & 0xffffffff00000000;
  local_4a8.data_._0_4_ = aom_codec_enc_config_default(iface,&cfg,0);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&enc,"AOM_CODEC_OK","aom_codec_enc_config_default(iface, &cfg, kUsage)",
             (aom_codec_err_t *)&gtest_ar_2,(aom_codec_err_t *)&local_4a8);
  if ((char)enc.name == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if (enc.iface == (aom_codec_iface_t *)0x0) {
      pSVar1 = "";
    }
    else {
      pSVar1 = (SEARCH_METHODS *)(enc.iface)->name;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x78,(char *)pSVar1);
    testing::internal::AssertHelper::operator=(&local_4a8,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    if (gtest_ar_2._0_8_ != 0) {
      (**(code **)(*(long *)gtest_ar_2._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&enc.iface);
  cfg.g_threads = 2;
  cfg.g_w = 0x200;
  cfg.g_h = 0x40;
  local_4a8.data_._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_enc_init_ver(&enc,iface,&cfg,flag,0x1d);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&gtest_ar_2,"AOM_CODEC_OK",
             "aom_codec_enc_init_ver(&enc, iface, &cfg, flag, (10 + (7 + (9)) + 3))",
             (aom_codec_err_t *)&local_4a8,(aom_codec_err_t *)&local_4a0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_4a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar1 = "";
    }
    else {
      pSVar1 = *(SEARCH_METHODS **)
                gtest_ar_2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x7d,(char *)pSVar1);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  local_4a8.data_._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_control(&enc,0xd,5);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&gtest_ar_2,"AOM_CODEC_OK","aom_codec_control(&enc, AOME_SET_CPUUSED, 5)",
             (aom_codec_err_t *)&local_4a8,(aom_codec_err_t *)&local_4a0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_4a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar1 = "";
    }
    else {
      pSVar1 = *(SEARCH_METHODS **)
                gtest_ar_2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x7e,(char *)pSVar1);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  local_4a8.data_._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_encode(&enc,&img,0,1,0);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&gtest_ar_2,"AOM_CODEC_OK","aom_codec_encode(&enc, &img, 0, 1, 0)",
             (aom_codec_err_t *)&local_4a8,(aom_codec_err_t *)&local_4a0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_4a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar1 = "";
    }
    else {
      pSVar1 = *(SEARCH_METHODS **)
                gtest_ar_2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x7f,(char *)pSVar1);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  local_4a8.data_._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_encode(&enc,(aom_image_t *)0x0,0,0,0);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&gtest_ar_2,"AOM_CODEC_OK","aom_codec_encode(&enc, nullptr, 0, 0, 0)",
             (aom_codec_err_t *)&local_4a8,(aom_codec_err_t *)&local_4a0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_4a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar1 = "";
    }
    else {
      pSVar1 = *(SEARCH_METHODS **)
                gtest_ar_2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x80,(char *)pSVar1);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  local_4a8.data_._0_4_ = 0;
  local_4a0.data_._0_4_ = aom_codec_destroy(&enc);
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)&gtest_ar_2,"AOM_CODEC_OK","aom_codec_destroy(&enc)",
             (aom_codec_err_t *)&local_4a8,(aom_codec_err_t *)&local_4a0);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_4a8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_2.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pSVar1 = "";
    }
    else {
      pSVar1 = *(SEARCH_METHODS **)
                gtest_ar_2.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/encode_small_width_height_test.cc"
               ,0x81,(char *)pSVar1);
    testing::internal::AssertHelper::operator=(&local_4a0,(Message *)&local_4a8);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    if ((long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_4a8.data_._4_4_,(aom_codec_err_t)local_4a8.data_) + 8))()
      ;
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_2.message_);
  return;
}

Assistant:

void EncodeSmallHeightMultiThreaded(aom_img_fmt fmt, aom_codec_flags_t flag) {
  // The image has only one tile and the tile is one AV1 superblock tall.
  // For speed >= 1, superblock size is 64x64 (see av1_select_sb_size()).
  constexpr int kWidth = 512;
  constexpr int kHeight = 64;

  aom_image_t img;
  EXPECT_EQ(&img, aom_img_wrap(&img, fmt, kWidth, kHeight, 1,
                               const_cast<unsigned char *>(kBuffer)));

  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_config_default(iface, &cfg, kUsage));
  cfg.g_threads = 2;
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  aom_codec_ctx_t enc;
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_enc_init(&enc, iface, &cfg, flag));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_control(&enc, AOME_SET_CPUUSED, 5));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, &img, 0, 1, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_encode(&enc, nullptr, 0, 0, 0));
  EXPECT_EQ(AOM_CODEC_OK, aom_codec_destroy(&enc));
}